

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O1

int Gia_Iso2ManCheckIsoClassOneSkip
              (Gia_Man_t *p,Vec_Int_t *vClass,Vec_Int_t *vRoots,Vec_Int_t *vVec0,Vec_Int_t *vVec1,
              Vec_Int_t *vMap0,Vec_Int_t *vMap1)

{
  Gia_Man_t *p_00;
  int iVar1;
  long lVar2;
  int iPo;
  int local_54;
  Vec_Int_t *local_50;
  Gia_Man_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  if (vClass->nSize < 2) {
    __assert_fail("Vec_IntSize(vClass) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso2.c"
                  ,0x22c,
                  "int Gia_Iso2ManCheckIsoClassOneSkip(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  local_54 = *vClass->pArray;
  local_50 = vMap0;
  local_48 = p;
  local_40 = vVec0;
  local_38 = vRoots;
  Gia_Iso2ManCollectOrder(p,&local_54,1,vRoots,vVec0,vMap0);
  if (1 < vClass->nSize) {
    lVar2 = 1;
    do {
      p_00 = local_48;
      local_54 = vClass->pArray[lVar2];
      Gia_Iso2ManCollectOrder(local_48,&local_54,1,local_38,vVec1,vMap1);
      if (local_40->nSize != vVec1->nSize) {
        return 0;
      }
      iVar1 = Gia_Iso2ManCheckIsoPair(p_00,local_40,vVec1,local_50,vMap1);
      if (iVar1 == 0) {
        return 0;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < vClass->nSize);
  }
  return 1;
}

Assistant:

int Gia_Iso2ManCheckIsoClassOneSkip( Gia_Man_t * p, Vec_Int_t * vClass, Vec_Int_t * vRoots, Vec_Int_t * vVec0, Vec_Int_t * vVec1, Vec_Int_t * vMap0, Vec_Int_t * vMap1 )
{
    int i, iPo;
    assert( Vec_IntSize(vClass) > 1 );
    iPo = Vec_IntEntry( vClass, 0 );
    Gia_Iso2ManCollectOrder( p, &iPo, 1, vRoots, vVec0, vMap0 );
    Vec_IntForEachEntryStart( vClass, iPo, i, 1 )
    {
        Gia_Iso2ManCollectOrder( p, &iPo, 1, vRoots, vVec1, vMap1 );
        if ( Vec_IntSize(vVec0) != Vec_IntSize(vVec1) )
            return 0;
        if ( !Gia_Iso2ManCheckIsoPair( p, vVec0, vVec1, vMap0, vMap1 ) )
            return 0;
    }
    return 1;
}